

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintString
          (string *__return_storage_ptr__,FieldValuePrinter *this,string *val)

{
  BaseTextGenerator local_40;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_40._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_0056d848;
  local_30 = 0;
  local_28 = '\0';
  local_38 = &local_28;
  FastFieldValuePrinter::PrintString((FastFieldValuePrinter *)__return_storage_ptr__,val,&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38 == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  __return_storage_ptr__->_M_string_length = local_30;
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintString(
    const std::string& val) const {
  FORWARD_IMPL(PrintString, val);
}